

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

char * matchbalance(MatchState *ms,char *s,char *p)

{
  char *pcVar1;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  int cont;
  int e;
  int b;
  ErrMsg in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  char *local_18;
  char *local_8;
  
  if ((*in_RDX != '\0') && (in_RDX[1] != '\0')) {
    if (*in_RSI == *in_RDX) {
      iVar2 = 1;
      pcVar1 = in_RSI;
      do {
        while( true ) {
          local_18 = pcVar1;
          pcVar1 = local_18 + 1;
          if (*(char **)(in_RDI + 8) <= pcVar1) {
            return (char *)0x0;
          }
          if (*pcVar1 == in_RDX[1]) break;
          if (*pcVar1 == *in_RDX) {
            iVar2 = iVar2 + 1;
          }
        }
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      local_8 = local_18 + 2;
    }
    else {
      local_8 = (char *)0x0;
    }
    return local_8;
  }
  lj_err_caller((lua_State *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                in_stack_ffffffffffffffcc);
}

Assistant:

static const char *matchbalance(MatchState *ms, const char *s, const char *p)
{
  if (*p == 0 || *(p+1) == 0)
    lj_err_caller(ms->L, LJ_ERR_STRPATU);
  if (*s != *p) {
    return NULL;
  } else {
    int b = *p;
    int e = *(p+1);
    int cont = 1;
    while (++s < ms->src_end) {
      if (*s == e) {
	if (--cont == 0) return s+1;
      } else if (*s == b) {
	cont++;
      }
    }
  }
  return NULL;  /* string ends out of balance */
}